

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+
          (TPZSFMatrix<long_double> *__return_storage_ptr__,TPZSFMatrix<long_double> *this,
          TPZMatrix<long_double> *A)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  longdouble *plVar3;
  long lVar4;
  int64_t c;
  long lVar5;
  int64_t r;
  long lVar6;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  
  iVar1 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  iVar2 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(A);
  if (CONCAT44(extraout_var,iVar1) != CONCAT44(extraout_var_00,iVar2)) {
    TPZMatrix<long_double>::Error
              ("TPZSFMatrix<TVar> TPZSFMatrix<long double>::operator+(const TPZMatrix<TVar> &) const [TVar = long double]"
               ,"Operator+ <matrixs with incoompatible dimensions");
  }
  TPZSFMatrix(__return_storage_ptr__,this);
  plVar3 = __return_storage_ptr__->fElem;
  lVar4 = 1;
  lVar5 = 0;
  while( true ) {
    iVar1 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var_01,iVar1) <= lVar5) break;
    for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(A,lVar6,lVar5);
      *plVar3 = *plVar3 + in_ST0;
      plVar3 = plVar3 + 1;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
    }
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSFMatrix<TVar>
TPZSFMatrix<TVar> ::operator+(const TPZMatrix<TVar>  &A ) const
{
	if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Operator+ <matrixs with incoompatible dimensions" );
	
	auto  res(*this);
	TVar *pr = res.fElem;
	for ( int64_t c = 0; c < this->Dim(); c++ )
		for ( int64_t r = 0; r <= c; r++ )
			*pr++ += A.Get( r, c );
	
	return res;
}